

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall
duckdb::StandardBufferManager::Prefetch
          (StandardBufferManager *this,
          vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *handles)

{
  _Rb_tree_header *p_Var1;
  reference this_00;
  BlockHandle *pBVar2;
  _Base_ptr p_Var3;
  long lVar4;
  block_id_t last_block;
  idx_t block_idx;
  ulong __n;
  block_id_t first_block;
  pair<long,_unsigned_long> local_70;
  map<long,_unsigned_long,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  to_be_loaded;
  
  p_Var1 = &to_be_loaded._M_t._M_impl.super__Rb_tree_header;
  to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __n = 0;
  to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; __n < (ulong)((long)(handles->
                             super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                             ).
                             super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(handles->
                             super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                             ).
                             super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1) {
    this_00 = vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true>::get<true>(handles,__n);
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(this_00);
    if ((pBVar2->state)._M_i != BLOCK_LOADED) {
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(this_00);
      local_70.first = pBVar2->block_id;
      local_70.second = __n;
      ::std::
      _Rb_tree<long,std::pair<long_const,unsigned_long>,std::_Select1st<std::pair<long_const,unsigned_long>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_long>>>
      ::_M_emplace_unique<std::pair<long,unsigned_long>>
                ((_Rb_tree<long,std::pair<long_const,unsigned_long>,std::_Select1st<std::pair<long_const,unsigned_long>>,std::less<long>,std::allocator<std::pair<long_const,unsigned_long>>>
                  *)&to_be_loaded,&local_70);
    }
  }
  if (to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    first_block = -1;
    last_block = first_block;
    p_Var3 = to_be_loaded._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var3 != p_Var1) {
      if (last_block < 0) {
LAB_0158704d:
        lVar4 = *(long *)(p_Var3 + 1);
        first_block = lVar4;
      }
      else {
        lVar4 = last_block + 1;
        if (lVar4 != *(long *)(p_Var3 + 1)) {
          BatchRead(this,handles,&to_be_loaded,first_block,last_block);
          goto LAB_0158704d;
        }
      }
      p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3);
      last_block = lVar4;
    }
    BatchRead(this,handles,&to_be_loaded,first_block,last_block);
  }
  ::std::
  _Rb_tree<long,_std::pair<const_long,_unsigned_long>,_std::_Select1st<std::pair<const_long,_unsigned_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  ::~_Rb_tree(&to_be_loaded._M_t);
  return;
}

Assistant:

void StandardBufferManager::Prefetch(vector<shared_ptr<BlockHandle>> &handles) {
	// figure out which set of blocks we should load
	map<block_id_t, idx_t> to_be_loaded;
	for (idx_t block_idx = 0; block_idx < handles.size(); block_idx++) {
		auto &handle = handles[block_idx];
		if (handle->GetState() != BlockState::BLOCK_LOADED) {
			// need to load this block - add it to the map
			to_be_loaded.insert(make_pair(handle->BlockId(), block_idx));
		}
	}
	if (to_be_loaded.empty()) {
		// nothing to fetch
		return;
	}
	// iterate over the blocks and perform bulk reads
	block_id_t first_block = -1;
	block_id_t previous_block_id = -1;
	for (auto &entry : to_be_loaded) {
		if (previous_block_id < 0) {
			// this the first block we are seeing
			first_block = entry.first;
			previous_block_id = first_block;
		} else if (previous_block_id + 1 == entry.first) {
			// this block is adjacent to the previous block - add it to the batch read
			previous_block_id = entry.first;
		} else {
			// this block is not adjacent to the previous block
			// perform the batch read for the previous batch
			BatchRead(handles, to_be_loaded, first_block, previous_block_id);

			// set the first_block and previous_block_id to the current block
			first_block = entry.first;
			previous_block_id = entry.first;
		}
	}
	// batch read the final batch
	BatchRead(handles, to_be_loaded, first_block, previous_block_id);
}